

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_store(CompilerHLSL *this,Instruction *instruction)

{
  uint32_t value;
  SPIRAccessChain *chain_00;
  SmallVector<unsigned_int,_8UL> local_60;
  SPIRAccessChain *local_28;
  SPIRAccessChain *chain;
  uint32_t *ops;
  Instruction *instruction_local;
  CompilerHLSL *this_local;
  
  ops = (uint32_t *)instruction;
  instruction_local = (Instruction *)this;
  chain = (SPIRAccessChain *)Compiler::stream((Compiler *)this,instruction);
  chain_00 = Compiler::maybe_get<spirv_cross::SPIRAccessChain>
                       ((Compiler *)this,*(uint32_t *)&(chain->super_IVariant)._vptr_IVariant);
  local_28 = chain_00;
  if (chain_00 == (SPIRAccessChain *)0x0) {
    CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,(Instruction *)ops);
  }
  else {
    value = *(uint32_t *)((long)&(chain->super_IVariant)._vptr_IVariant + 4);
    SmallVector<unsigned_int,_8UL>::SmallVector(&local_60);
    write_access_chain(this,chain_00,value,&local_60);
    SmallVector<unsigned_int,_8UL>::~SmallVector(&local_60);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_store(const Instruction &instruction)
{
	auto ops = stream(instruction);
	auto *chain = maybe_get<SPIRAccessChain>(ops[0]);
	if (chain)
		write_access_chain(*chain, ops[1], {});
	else
		CompilerGLSL::emit_instruction(instruction);
}